

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O1

void __thiscall
icu_63::CollationRuleParser::parseStarredCharacters
          (CollationRuleParser *this,int32_t strength,int32_t i,UErrorCode *errorCode)

{
  short sVar1;
  Sink *pSVar2;
  UnicodeString *pUVar3;
  bool bVar4;
  int32_t iVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  char16_t *pcVar10;
  char *pcVar11;
  uint uVar12;
  UnicodeString s;
  UnicodeString raw;
  UnicodeString empty;
  uint local_110;
  uint local_10c;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e6fd8;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e6fd8;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar5 = skipWhiteSpace(this,i);
  local_10c = parseString(this,iVar5,&local_b0,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((ushort)local_b0.fUnion.fStackFields.fLengthAndFlags < 0x20) {
      *errorCode = U_INVALID_FORMAT_ERROR;
      this->errorReason = "missing starred-relation string";
      if (this->parseError != (UParseError *)0x0) {
        setErrorContext(this);
      }
    }
    else {
      iVar5 = 0;
      local_110 = 0xffffffff;
      do {
        while( true ) {
          uVar6 = local_b0.fUnion.fFields.fLength;
          if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
            uVar6 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (iVar5 < (int)uVar6) break;
          pUVar3 = this->rules;
          sVar1 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            uVar7 = (pUVar3->fUnion).fFields.fLength;
          }
          else {
            uVar7 = (int)sVar1 >> 5;
          }
          if (uVar7 <= local_10c || (int)uVar7 <= (int)local_10c) {
LAB_0023e7c3:
            iVar5 = skipWhiteSpace(this,local_10c);
            this->ruleIndex = iVar5;
            goto LAB_0023e41c;
          }
          if (((int)sVar1 & 2U) == 0) {
            pcVar10 = (pUVar3->fUnion).fFields.fArray;
          }
          else {
            pcVar10 = (char16_t *)((long)&pUVar3->fUnion + 2);
          }
          if (pcVar10[(int)local_10c] != L'-') goto LAB_0023e7c3;
          if ((int)local_110 < 0) {
            if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
              *errorCode = U_INVALID_FORMAT_ERROR;
              pcVar11 = "range without start in starred-relation string";
LAB_0023e800:
              this->errorReason = pcVar11;
              if (this->parseError != (UParseError *)0x0) {
                setErrorContext(this);
              }
            }
            goto LAB_0023e41c;
          }
          local_10c = parseString(this,local_10c + 1,&local_b0,errorCode);
          if (U_ZERO_ERROR < *errorCode) goto LAB_0023e41c;
          if ((ushort)local_b0.fUnion.fStackFields.fLengthAndFlags < 0x20) {
            *errorCode = U_INVALID_FORMAT_ERROR;
            pcVar11 = "range without end in starred-relation string";
            goto LAB_0023e800;
          }
          uVar7 = UnicodeString::char32At(&local_b0,0);
          if ((int)uVar7 < (int)local_110) {
            if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
              *errorCode = U_INVALID_FORMAT_ERROR;
              this->errorReason = "range start greater than end in starred-relation string";
              if (this->parseError != (UParseError *)0x0) {
                setErrorContext(this);
              }
            }
            bVar4 = false;
          }
          else {
            local_f0.super_Replaceable.super_UObject._vptr_UObject =
                 (UObject)&PTR__UnicodeString_003e6fd8;
            local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
            uVar12 = -local_110;
            uVar9 = local_110 - 0xfffc;
            do {
              if (uVar7 + uVar12 == 0) {
                iVar5 = 2 - (uint)(uVar7 < 0x10000);
                local_110 = 0xffffffff;
                bVar4 = true;
                goto LAB_0023e77d;
              }
              local_110 = uVar9 + 0xfffd;
              iVar8 = (*(this->nfd->super_UObject)._vptr_UObject[0x11])();
              if ((char)iVar8 == '\0') {
                bVar4 = (int)uVar7 <= (int)-uVar12;
                if (U_ZERO_ERROR < *errorCode) goto LAB_0023e77d;
                *errorCode = U_INVALID_FORMAT_ERROR;
                pcVar11 = "starred-relation string range is not all NFD-inert";
LAB_0023e76a:
                this->errorReason = pcVar11;
                if (this->parseError == (UParseError *)0x0) goto LAB_0023e77d;
                goto LAB_0023e775;
              }
              if ((local_110 & 0x7ffff800) == 0xd800) {
                bVar4 = (int)uVar7 <= (int)-uVar12;
                if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
                  *errorCode = U_INVALID_FORMAT_ERROR;
                  pcVar11 = "starred-relation string range contains a surrogate";
                  goto LAB_0023e76a;
                }
                goto LAB_0023e77d;
              }
              if (uVar9 < 3) {
                bVar4 = (int)uVar7 <= (int)-uVar12;
                if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
                  *errorCode = U_INVALID_FORMAT_ERROR;
                  pcVar11 = "starred-relation string range contains U+FFFD, U+FFFE or U+FFFF";
                  goto LAB_0023e76a;
                }
                goto LAB_0023e77d;
              }
              UnicodeString::unBogus(&local_f0);
              uVar6 = local_f0.fUnion.fFields.fLength;
              if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
                uVar6 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              UnicodeString::replace(&local_f0,0,uVar6,local_110);
              (*(this->sink->super_UObject)._vptr_UObject[4])
                        (this->sink,(ulong)(uint)strength,&local_70,&local_f0,&local_70,
                         &this->errorReason,errorCode);
              uVar12 = uVar12 - 1;
              uVar9 = uVar9 + 1;
            } while (*errorCode < U_ILLEGAL_ARGUMENT_ERROR);
            bVar4 = (int)uVar7 <= (int)~uVar12;
LAB_0023e775:
            setErrorContext(this);
LAB_0023e77d:
            UnicodeString::~UnicodeString(&local_f0);
          }
          if (!bVar4) goto LAB_0023e41c;
        }
        uVar7 = UnicodeString::char32At(&local_b0,iVar5);
        iVar8 = (*(this->nfd->super_UObject)._vptr_UObject[0x11])(this->nfd,(ulong)uVar7);
        if ((char)iVar8 == '\0') {
          if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            *errorCode = U_INVALID_FORMAT_ERROR;
            this->errorReason = "starred-relation string is not all NFD-inert";
            if (this->parseError != (UParseError *)0x0) goto LAB_0023e504;
          }
LAB_0023e514:
          bVar4 = false;
          uVar7 = local_110;
        }
        else {
          pSVar2 = this->sink;
          UnicodeString::UnicodeString(&local_f0,uVar7);
          (*(pSVar2->super_UObject)._vptr_UObject[4])
                    (pSVar2,(ulong)(uint)strength,&local_70,&local_f0,&local_70,&this->errorReason,
                     errorCode);
          UnicodeString::~UnicodeString(&local_f0);
          if (U_ZERO_ERROR < *errorCode) {
LAB_0023e504:
            setErrorContext(this);
            goto LAB_0023e514;
          }
          iVar5 = (iVar5 - (uint)(uVar7 < 0x10000)) + 2;
          bVar4 = true;
        }
        local_110 = uVar7;
      } while (bVar4);
    }
  }
LAB_0023e41c:
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void
CollationRuleParser::parseStarredCharacters(int32_t strength, int32_t i, UErrorCode &errorCode) {
    UnicodeString empty, raw;
    i = parseString(skipWhiteSpace(i), raw, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    if(raw.isEmpty()) {
        setParseError("missing starred-relation string", errorCode);
        return;
    }
    UChar32 prev = -1;
    int32_t j = 0;
    for(;;) {
        while(j < raw.length()) {
            UChar32 c = raw.char32At(j);
            if(!nfd.isInert(c)) {
                setParseError("starred-relation string is not all NFD-inert", errorCode);
                return;
            }
            sink->addRelation(strength, empty, UnicodeString(c), empty, errorReason, errorCode);
            if(U_FAILURE(errorCode)) {
                setErrorContext();
                return;
            }
            j += U16_LENGTH(c);
            prev = c;
        }
        if(i >= rules->length() || rules->charAt(i) != 0x2d) {  // '-'
            break;
        }
        if(prev < 0) {
            setParseError("range without start in starred-relation string", errorCode);
            return;
        }
        i = parseString(i + 1, raw, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(raw.isEmpty()) {
            setParseError("range without end in starred-relation string", errorCode);
            return;
        }
        UChar32 c = raw.char32At(0);
        if(c < prev) {
            setParseError("range start greater than end in starred-relation string", errorCode);
            return;
        }
        // range prev-c
        UnicodeString s;
        while(++prev <= c) {
            if(!nfd.isInert(prev)) {
                setParseError("starred-relation string range is not all NFD-inert", errorCode);
                return;
            }
            if(U_IS_SURROGATE(prev)) {
                setParseError("starred-relation string range contains a surrogate", errorCode);
                return;
            }
            if(0xfffd <= prev && prev <= 0xffff) {
                setParseError("starred-relation string range contains U+FFFD, U+FFFE or U+FFFF", errorCode);
                return;
            }
            s.setTo(prev);
            sink->addRelation(strength, empty, s, empty, errorReason, errorCode);
            if(U_FAILURE(errorCode)) {
                setErrorContext();
                return;
            }
        }
        prev = -1;
        j = U16_LENGTH(c);
    }
    ruleIndex = skipWhiteSpace(i);
}